

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_raw_buffer(uchar **p,uchar *start,uchar *buf,size_t size)

{
  size_t len;
  size_t size_local;
  uchar *buf_local;
  uchar *start_local;
  uchar **p_local;
  
  if ((*p < start) || ((ulong)((long)*p - (long)start) < size)) {
    p_local._4_4_ = -0x6c;
  }
  else {
    *p = *p + -size;
    memcpy(*p,buf,size);
    p_local._4_4_ = (int)size;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_raw_buffer(unsigned char **p, const unsigned char *start,
                                  const unsigned char *buf, size_t size)
{
    size_t len = 0;

    if (*p < start || (size_t) (*p - start) < size) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    len = size;
    (*p) -= len;
    memcpy(*p, buf, len);

    return (int) len;
}